

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_9::DiskDirectory::tryOpenSubdir(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  Directory *pDVar2;
  Directory *extraout_RDX_00;
  WriteMode in_R8D;
  size_t *this_00;
  Maybe<kj::Own<kj::Directory,_std::nullptr_t>_> MVar3;
  Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> MVar4;
  PathPtr path_00;
  PathPtr path_01;
  DiskHandle local_40;
  OwnFd local_3c;
  NullableValue<kj::OwnFd> local_38;
  undefined8 local_30;
  Directory *extraout_RDX;
  
  path_00.parts.size_._4_4_ = in_register_0000000c;
  path_00.parts.size_._0_4_ = mode;
  path_01.parts.size_ = (String *)path.parts.size_;
  this_00 = &((path.parts.ptr)->content).size_;
  if ((in_R8D & CREATE) != 0) {
    path_00.parts.ptr = path_01.parts.size_;
    bVar1 = DiskHandle::tryMkdir((DiskHandle *)this_00,path_00,in_R8D,false);
    if (!bVar1) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      *(undefined8 *)&this->super_DiskHandle = 0;
      pDVar2 = extraout_RDX;
      goto LAB_00208bf8;
    }
  }
  path_01.parts.ptr = (String *)this_00;
  DiskHandle::tryOpenSubdirInternal(&local_40,path_01);
  MVar3 = Maybe<kj::OwnFd>::map<kj::Own<kj::Directory,_std::nullptr_t>_(&)(kj::OwnFd)>
                    ((Maybe<kj::OwnFd> *)&local_38,
                     (_func_Own<kj::Directory,_std::nullptr_t>_OwnFd *)&local_40);
  pDVar2 = MVar3.ptr.ptr;
  (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)local_38
  ;
  *(undefined8 *)&this->super_DiskHandle = local_30;
  local_30 = 0;
  if ((char)local_40.fd.fd == '\x01') {
    OwnFd::~OwnFd(&local_3c);
    pDVar2 = extraout_RDX_00;
  }
LAB_00208bf8:
  MVar4.ptr.ptr = pDVar2;
  MVar4.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>)MVar4.ptr;
}

Assistant:

Maybe<Own<const Directory>> tryOpenSubdir(PathPtr path, WriteMode mode) const override {
    return DiskHandle::tryOpenSubdir(path, mode);
  }